

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBench.c
# Opt level: O3

int Io_WriteBenchCheckNames(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  byte *pbVar2;
  long lVar3;
  
  pVVar1 = pNtk->vObjs;
  if (0 < pVVar1->nSize) {
    lVar3 = 0;
    do {
      if ((pVVar1->pArray[lVar3] != (void *)0x0) &&
         (pbVar2 = (byte *)Nm_ManFindNameById(pNtk->pManName,(int)lVar3), pbVar2 != (byte *)0x0)) {
        while( true ) {
          if (*pbVar2 - 0x28 < 2) {
            return 0;
          }
          if (*pbVar2 == 0) break;
          pbVar2 = pbVar2 + 1;
        }
      }
      lVar3 = lVar3 + 1;
      pVVar1 = pNtk->vObjs;
    } while (lVar3 < pVVar1->nSize);
  }
  return 1;
}

Assistant:

int Io_WriteBenchCheckNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    char * pName;
    int i;
    Abc_NtkForEachObj( pNtk, pObj, i )
        for ( pName = Nm_ManFindNameById(pNtk->pManName, i); pName && *pName; pName++ )
            if ( *pName == '(' || *pName == ')' )
                return 0;
    return 1;
}